

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aeskey.c
# Opt level: O2

int aes_encrypt_key256(uchar *key,aes_encrypt_ctx *cx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar12 = *(uint *)key;
  cx->ks[0] = uVar12;
  uVar5 = *(uint *)(key + 4);
  cx->ks[1] = uVar5;
  uVar8 = *(uint *)(key + 8);
  cx->ks[2] = uVar8;
  uVar15 = *(uint *)(key + 0xc);
  cx->ks[3] = uVar15;
  uVar14 = *(uint *)(key + 0x10);
  cx->ks[4] = uVar14;
  uVar7 = *(uint *)(key + 0x14);
  cx->ks[5] = uVar7;
  uVar9 = *(uint *)(key + 0x18);
  cx->ks[6] = uVar9;
  bVar1 = key[0x1f];
  bVar2 = key[0x1e];
  bVar3 = key[0x1d];
  bVar4 = key[0x1c];
  uVar6 = (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18 | (uint)bVar4;
  cx->ks[7] = uVar6;
  uVar12 = t_fl[0][bVar3] ^ t_fl[1][bVar2] ^ t_fl[2][bVar1] ^ t_fl[3][bVar4] ^ 1 ^ uVar12;
  cx->ks[8] = uVar12;
  cx->ks[9] = uVar12 ^ uVar5;
  uVar8 = uVar12 ^ uVar5 ^ uVar8;
  cx->ks[10] = uVar8;
  uVar10 = uVar8 ^ uVar15;
  cx->ks[0xb] = uVar10;
  uVar14 = t_fl[0][uVar10 & 0xff] ^ t_fl[1][uVar10 >> 8 & 0xff] ^
           *(uint *)((long)t_fl[2] + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ t_fl[3][uVar10 >> 0x18] ^
           uVar14;
  cx->ks[0xc] = uVar14;
  cx->ks[0xd] = uVar14 ^ uVar7;
  uVar9 = uVar14 ^ uVar7 ^ uVar9;
  cx->ks[0xe] = uVar9;
  uVar10 = uVar9 ^ uVar6;
  cx->ks[0xf] = uVar10;
  uVar10 = *(uint *)((long)t_fl[1] + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ t_fl[0][uVar10 >> 8 & 0xff] ^
           t_fl[2][uVar10 >> 0x18] ^ t_fl[3][uVar10 & 0xff] ^ 2;
  uVar12 = uVar12 ^ uVar10;
  cx->ks[0x10] = uVar12;
  uVar10 = uVar10 ^ uVar5;
  cx->ks[0x11] = uVar10;
  cx->ks[0x12] = uVar10 ^ uVar8;
  uVar13 = uVar10 ^ uVar15;
  cx->ks[0x13] = uVar13;
  uVar11 = t_fl[1][uVar13 >> 8 & 0xff] ^ t_fl[0][uVar13 & 0xff] ^
           *(uint *)((long)t_fl[2] + (ulong)(uVar13 >> 0xe & 0x3fc)) ^ t_fl[3][uVar13 >> 0x18];
  uVar14 = uVar14 ^ uVar11;
  cx->ks[0x14] = uVar14;
  uVar11 = uVar11 ^ uVar7;
  cx->ks[0x15] = uVar11;
  cx->ks[0x16] = uVar11 ^ uVar9;
  uVar5 = uVar11 ^ uVar6;
  cx->ks[0x17] = uVar5;
  uVar12 = t_fl[0][uVar5 >> 8 & 0xff] ^ *(uint *)((long)t_fl[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^
           t_fl[2][uVar5 >> 0x18] ^ t_fl[3][uVar5 & 0xff] ^ 4 ^ uVar12;
  cx->ks[0x18] = uVar12;
  cx->ks[0x19] = uVar12 ^ uVar10;
  uVar8 = uVar8 ^ uVar12;
  cx->ks[0x1a] = uVar8;
  uVar13 = uVar13 ^ uVar8;
  cx->ks[0x1b] = uVar13;
  uVar14 = t_fl[0][uVar13 & 0xff] ^ t_fl[1][uVar13 >> 8 & 0xff] ^
           *(uint *)((long)t_fl[2] + (ulong)(uVar13 >> 0xe & 0x3fc)) ^ t_fl[3][uVar13 >> 0x18] ^
           uVar14;
  cx->ks[0x1c] = uVar14;
  cx->ks[0x1d] = uVar14 ^ uVar11;
  uVar9 = uVar9 ^ uVar14;
  cx->ks[0x1e] = uVar9;
  uVar5 = uVar5 ^ uVar9;
  cx->ks[0x1f] = uVar5;
  uVar5 = *(uint *)((long)t_fl[1] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ t_fl[0][uVar5 >> 8 & 0xff] ^
          t_fl[2][uVar5 >> 0x18] ^ t_fl[3][uVar5 & 0xff] ^ 8;
  cx->ks[0x20] = uVar12 ^ uVar5;
  uVar10 = uVar10 ^ uVar5;
  cx->ks[0x21] = uVar10;
  cx->ks[0x22] = uVar10 ^ uVar8;
  uVar15 = uVar5 ^ uVar15;
  cx->ks[0x23] = uVar15;
  uVar7 = t_fl[1][uVar15 >> 8 & 0xff] ^ t_fl[0][uVar15 & 0xff] ^
          *(uint *)((long)t_fl[2] + (ulong)(uVar15 >> 0xe & 0x3fc)) ^ t_fl[3][uVar15 >> 0x18];
  cx->ks[0x24] = uVar14 ^ uVar7;
  uVar11 = uVar11 ^ uVar7;
  cx->ks[0x25] = uVar11;
  cx->ks[0x26] = uVar11 ^ uVar9;
  uVar6 = uVar7 ^ uVar6;
  cx->ks[0x27] = uVar6;
  uVar5 = t_fl[0][uVar6 >> 8 & 0xff] ^ *(uint *)((long)t_fl[1] + (ulong)(uVar6 >> 0xe & 0x3fc)) ^
          t_fl[2][uVar6 >> 0x18] ^ t_fl[3][uVar6 & 0xff] ^ 0x10 ^ uVar12 ^ uVar5;
  cx->ks[0x28] = uVar5;
  cx->ks[0x29] = uVar5 ^ uVar10;
  uVar8 = uVar8 ^ uVar5;
  cx->ks[0x2a] = uVar8;
  uVar12 = uVar8 ^ uVar15;
  cx->ks[0x2b] = uVar12;
  uVar12 = t_fl[0][uVar12 & 0xff] ^ t_fl[1][uVar12 >> 8 & 0xff] ^
           *(uint *)((long)t_fl[2] + (ulong)(uVar12 >> 0xe & 0x3fc)) ^ t_fl[3][uVar12 >> 0x18] ^
           uVar14 ^ uVar7;
  cx->ks[0x2c] = uVar12;
  cx->ks[0x2d] = uVar12 ^ uVar11;
  uVar9 = uVar9 ^ uVar12;
  cx->ks[0x2e] = uVar9;
  uVar14 = uVar9 ^ uVar6;
  cx->ks[0x2f] = uVar14;
  uVar7 = *(uint *)((long)t_fl[1] + (ulong)(uVar14 >> 0xe & 0x3fc)) ^ t_fl[0][uVar14 >> 8 & 0xff] ^
          t_fl[2][uVar14 >> 0x18] ^ t_fl[3][uVar14 & 0xff] ^ 0x20;
  uVar5 = uVar5 ^ uVar7;
  cx->ks[0x30] = uVar5;
  uVar7 = uVar7 ^ uVar10;
  cx->ks[0x31] = uVar7;
  cx->ks[0x32] = uVar7 ^ uVar8;
  uVar15 = uVar15 ^ uVar7;
  cx->ks[0x33] = uVar15;
  uVar14 = t_fl[1][uVar15 >> 8 & 0xff] ^ t_fl[0][uVar15 & 0xff] ^
           *(uint *)((long)t_fl[2] + (ulong)(uVar15 >> 0xe & 0x3fc)) ^ t_fl[3][uVar15 >> 0x18];
  cx->ks[0x34] = uVar12 ^ uVar14;
  uVar14 = uVar14 ^ uVar11;
  cx->ks[0x35] = uVar14;
  cx->ks[0x36] = uVar9 ^ uVar14;
  uVar14 = uVar14 ^ uVar6;
  cx->ks[0x37] = uVar14;
  uVar5 = t_fl[0][uVar14 >> 8 & 0xff] ^ *(uint *)((long)t_fl[1] + (ulong)(uVar14 >> 0xe & 0x3fc)) ^
          t_fl[2][uVar14 >> 0x18] ^ t_fl[3][uVar14 & 0xff] ^ 0x40 ^ uVar5;
  cx->ks[0x38] = uVar5;
  cx->ks[0x39] = uVar7 ^ uVar5;
  cx->ks[0x3a] = uVar5 ^ uVar8;
  cx->ks[0x3b] = uVar5 ^ uVar8 ^ uVar15;
  (cx->inf).l = 0xe0;
  return 0;
}

Assistant:

AES_RETURN aes_xi(encrypt_key256)(const unsigned char *key, aes_encrypt_ctx cx[1])
{   uint32_t    ss[8];

    cx->ks[0] = ss[0] = word_in(key, 0);
    cx->ks[1] = ss[1] = word_in(key, 1);
    cx->ks[2] = ss[2] = word_in(key, 2);
    cx->ks[3] = ss[3] = word_in(key, 3);
    cx->ks[4] = ss[4] = word_in(key, 4);
    cx->ks[5] = ss[5] = word_in(key, 5);
    cx->ks[6] = ss[6] = word_in(key, 6);
    cx->ks[7] = ss[7] = word_in(key, 7);

#ifdef ENC_KS_UNROLL
    ke8(cx->ks, 0); ke8(cx->ks, 1);
    ke8(cx->ks, 2); ke8(cx->ks, 3);
    ke8(cx->ks, 4); ke8(cx->ks, 5);
#else
    {   uint32_t i;
        for(i = 0; i < 6; ++i)
            ke8(cx->ks,  i);
    }
#endif
    kef8(cx->ks, 6);
    cx->inf.l = 0;
    cx->inf.b[0] = 14 * 16;

#ifdef USE_VIA_ACE_IF_PRESENT
    if(VIA_ACE_AVAILABLE)
        cx->inf.b[1] = 0xff;
#endif
    return EXIT_SUCCESS;
}